

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O2

ssize_t __thiscall
FIX::ThreadedSocketConnection::read
          (ThreadedSocketConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  Session *this_00;
  int iVar1;
  ssize_t size;
  SocketRecvFailed *pSVar2;
  UtcTimeStamp local_50;
  pollfd pfd;
  
  pfd.fd = this->m_socket;
  pfd.events = 3;
  pfd.revents = 0;
  iVar1 = poll((pollfd *)&pfd,1,1000);
  if (iVar1 < 1) {
    if (iVar1 != 0) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,(long)iVar1);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,Exception::~Exception);
    }
    this_00 = this->m_pSession;
    if (this_00 != (Session *)0x0) {
      UtcTimeStamp::now();
      Session::next(this_00,&local_50);
    }
  }
  else {
    size = socket_recv(this->m_socket,this->m_buffer,0x2000);
    if (size < 1) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,size);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,Exception::~Exception);
    }
    std::__cxx11::string::append((char *)&this->m_parser,(ulong)this->m_buffer);
  }
  processStream(this);
  return CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
}

Assistant:

bool ThreadedSocketConnection::read() {
#if _MSC_VER
  struct timeval timeout = {1, 0};
  fd_set readset = m_fds;
#else
  int timeout = 1000; // 1000ms = 1 second
  struct pollfd pfd = {m_socket, POLLIN | POLLPRI, 0};
#endif

  try {
    // Wait for input (1 second timeout)
#if _MSC_VER
    int result = select(0, &readset, 0, 0, &timeout);
#else
    int result = poll(&pfd, 1, timeout);
#endif

    if (result > 0) // Something to read
    {
      // We can read without blocking
      ssize_t size = socket_recv(m_socket, m_buffer, sizeof(m_buffer));
      if (size <= 0) {
        throw SocketRecvFailed(size);
      }
      m_parser.addToStream(m_buffer, size);
    } else if (result == 0 && m_pSession) // Timeout
    {
      m_pSession->next(UtcTimeStamp::now());
    } else if (result < 0) // Error
    {
      throw SocketRecvFailed(result);
    }

    processStream();
    return true;
  } catch (SocketRecvFailed &e) {
    if (m_disconnect) {
      return false;
    }

    if (m_pSession) {
      m_pSession->getLog()->onEvent(e.what());
      m_pSession->disconnect();
    } else {
      disconnect();
    }

    return false;
  }
}